

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_alloc.c
# Opt level: O0

void mspace_malloc_stats(mspace msp)

{
  mstate ms;
  mspace msp_local;
  
  internal_malloc_stats((mstate)msp);
  return;
}

Assistant:

void mspace_malloc_stats(mspace msp) {
  mstate ms = (mstate)msp;
  if (ok_magic(ms)) {
    internal_malloc_stats(ms);
  }
  else {
    USAGE_ERROR_ACTION(ms,ms);
  }
}